

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined4 uVar8;
  stbi__uint32 *psVar9;
  stbi__uint32 *psVar10;
  stbi_uc sVar11;
  byte bVar12;
  uchar uVar13;
  int iVar14;
  stbi__uint32 sVar15;
  uint uVar16;
  int iVar17;
  stbi__jpeg *psVar18;
  long lVar19;
  stbi__uint16 *data_00;
  uchar *data_01;
  void *pvVar20;
  code *pcVar21;
  stbi__context *psVar22;
  float *data_02;
  stbi_uc *psVar23;
  uchar *puVar24;
  byte *pbVar25;
  long lVar26;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar27;
  uint uVar28;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar29;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  stbi_uc *extraout_RDX_13;
  stbi_uc *extraout_RDX_14;
  stbi_uc *extraout_RDX_15;
  undefined1 auVar30 [8];
  ulong uVar31;
  ulong uVar32;
  stbi_uc *psVar33;
  stbi_uc *psVar34;
  short *psVar35;
  long lVar36;
  undefined7 uVar37;
  int iVar38;
  int iVar39;
  undefined4 in_register_00000084;
  ulong uVar40;
  stbi__result_info *ri_00;
  ulong uVar41;
  int iVar42;
  int iVar43;
  stbi__uint16 *psVar44;
  stbi_uc (*pasVar45) [4];
  int *piVar46;
  stbi__context *psVar47;
  short sVar48;
  int iVar49;
  uint uVar50;
  bool bVar51;
  undefined1 auVar52 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_8980;
  uint local_8968;
  ulong local_8950;
  uint local_8944;
  uint local_8938;
  uint local_892c;
  undefined1 local_8928 [8];
  undefined8 uStack_8920;
  undefined8 local_8918;
  undefined8 uStack_8910;
  stbi__uint32 *local_8900;
  stbi__uint32 *local_88f8;
  uint local_88ec;
  int *local_88e8;
  int *local_88e0;
  undefined8 local_88d8;
  uint local_88cc;
  stbi_uc *local_88c8;
  ulong local_88c0;
  stbi__uint32 local_88b4;
  uint local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar33 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_8900 = (stbi__uint32 *)x;
  local_88f8 = (stbi__uint32 *)y;
  local_88e8 = comp;
  psVar18 = (stbi__jpeg *)malloc(0x4888);
  psVar18->s = s;
  psVar18->idct_block_kernel = stbi__idct_simd;
  psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar18->jfif = 0;
  psVar18->app14_color_transform = -1;
  psVar18->marker = 0xff;
  sVar11 = stbi__get_marker(psVar18);
  if (sVar11 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar18);
  if (sVar11 == 0xd8) {
    psVar18 = (stbi__jpeg *)malloc(0x4888);
    psVar18->s = s;
    psVar18->idct_block_kernel = stbi__idct_simd;
    psVar18->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar18->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar18->img_comp;
      lVar19 = 0x46d8;
      do {
        psVar33 = psVar18->huff_dc[0].fast + lVar19 + -8;
        psVar33[0] = '\0';
        psVar33[1] = '\0';
        psVar33[2] = '\0';
        psVar33[3] = '\0';
        psVar33[4] = '\0';
        psVar33[5] = '\0';
        psVar33[6] = '\0';
        psVar33[7] = '\0';
        psVar33[8] = '\0';
        psVar33[9] = '\0';
        psVar33[10] = '\0';
        psVar33[0xb] = '\0';
        psVar33[0xc] = '\0';
        psVar33[0xd] = '\0';
        psVar33[0xe] = '\0';
        psVar33[0xf] = '\0';
        lVar19 = lVar19 + 0x60;
      } while (lVar19 != 0x4858);
      psVar18->restart_interval = 0;
      iVar14 = stbi__decode_jpeg_header(psVar18,0);
      uVar50 = extraout_EDX;
      if (iVar14 != 0) {
        bVar12 = stbi__get_marker(psVar18);
        local_88e0 = psVar18->huff_ac[0].delta + 9;
LAB_0010b369:
        if (bVar12 == 0xda) {
          iVar14 = stbi__get16be(psVar18->s);
          psVar22 = psVar18->s;
          pbVar25 = psVar22->img_buffer;
          paVar29 = extraout_RDX_00;
          if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b449:
            psVar22->img_buffer = pbVar25 + 1;
            bVar12 = *pbVar25;
          }
          else {
            if (psVar22->read_from_callbacks != 0) {
              psVar33 = psVar22->buffer_start;
              iVar43 = (*(psVar22->io).read)(psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
              if (iVar43 == 0) {
                psVar22->read_from_callbacks = 0;
                psVar22->img_buffer = psVar33;
                psVar22->img_buffer_end = psVar22->buffer_start + 1;
                psVar22->buffer_start[0] = '\0';
              }
              else {
                psVar22->img_buffer = psVar33;
                psVar22->img_buffer_end = psVar33 + iVar43;
              }
              pbVar25 = psVar22->img_buffer;
              paVar29 = extraout_RDX_01;
              goto LAB_0010b449;
            }
            bVar12 = 0;
          }
          psVar18->scan_n = (uint)bVar12;
          if ((0xfb < (byte)(bVar12 - 5)) && ((int)(uint)bVar12 <= psVar18->s->img_n)) {
            if (iVar14 != (uint)bVar12 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_0010d8e0;
            }
            if (bVar12 != 0) {
              lVar19 = 0;
              do {
                psVar22 = psVar18->s;
                pbVar25 = psVar22->img_buffer;
                if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b504:
                  psVar22->img_buffer = pbVar25 + 1;
                  uVar27 = (uint)*pbVar25;
                }
                else {
                  if (psVar22->read_from_callbacks != 0) {
                    psVar33 = psVar22->buffer_start;
                    iVar14 = (*(psVar22->io).read)
                                       (psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
                    if (iVar14 == 0) {
                      psVar22->read_from_callbacks = 0;
                      psVar22->img_buffer = psVar33;
                      psVar22->img_buffer_end = psVar22->buffer_start + 1;
                      psVar22->buffer_start[0] = '\0';
                    }
                    else {
                      psVar22->img_buffer = psVar33;
                      psVar22->img_buffer_end = psVar33 + iVar14;
                    }
                    pbVar25 = psVar22->img_buffer;
                    goto LAB_0010b504;
                  }
                  uVar27 = 0;
                }
                psVar22 = psVar18->s;
                pbVar25 = psVar22->img_buffer;
                if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b583:
                  psVar22->img_buffer = pbVar25 + 1;
                  bVar12 = *pbVar25;
                }
                else {
                  if (psVar22->read_from_callbacks != 0) {
                    psVar33 = psVar22->buffer_start;
                    iVar14 = (*(psVar22->io).read)
                                       (psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
                    if (iVar14 == 0) {
                      psVar22->read_from_callbacks = 0;
                      psVar22->img_buffer = psVar33;
                      psVar22->img_buffer_end = psVar22->buffer_start + 1;
                      psVar22->buffer_start[0] = '\0';
                    }
                    else {
                      psVar22->img_buffer = psVar33;
                      psVar22->img_buffer_end = psVar33 + iVar14;
                    }
                    pbVar25 = psVar22->img_buffer;
                    goto LAB_0010b583;
                  }
                  bVar12 = 0;
                }
                uVar50 = psVar18->s->img_n;
                if ((int)uVar50 < 1) {
                  uVar32 = 0;
                }
                else {
                  uVar32 = 0;
                  paVar29 = paVar1;
                  do {
                    if (paVar29->id == uVar27) goto LAB_0010b5bb;
                    uVar32 = uVar32 + 1;
                    paVar29 = paVar29 + 1;
                  } while (uVar50 != uVar32);
                  uVar32 = (ulong)uVar50;
                }
LAB_0010b5bb:
                if ((uint)uVar32 == uVar50) goto LAB_0010d8e7;
                uVar31 = uVar32 & 0xffffffff;
                paVar29 = (anon_struct_96_18_0d0905d3 *)(uVar31 * 0x60);
                psVar18->img_comp[uVar31].hd = (uint)(bVar12 >> 4);
                if (0x3f < bVar12) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_0010d8e0;
                }
                paVar29 = paVar1 + uVar31;
                paVar29->ha = bVar12 & 0xf;
                if (3 < (bVar12 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_0010d8e0;
                }
                psVar18->order[lVar19] = (uint)uVar32;
                lVar19 = lVar19 + 1;
              } while (lVar19 < psVar18->scan_n);
            }
            psVar22 = psVar18->s;
            pbVar25 = psVar22->img_buffer;
            if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b681:
              psVar22->img_buffer = pbVar25 + 1;
              uVar50 = (uint)*pbVar25;
            }
            else {
              if (psVar22->read_from_callbacks != 0) {
                psVar33 = psVar22->buffer_start;
                iVar14 = (*(psVar22->io).read)
                                   (psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
                if (iVar14 == 0) {
                  psVar22->read_from_callbacks = 0;
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar22->buffer_start + 1;
                  psVar22->buffer_start[0] = '\0';
                }
                else {
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar33 + iVar14;
                }
                pbVar25 = psVar22->img_buffer;
                goto LAB_0010b681;
              }
              uVar50 = 0;
            }
            psVar18->spec_start = uVar50;
            psVar22 = psVar18->s;
            pbVar25 = psVar22->img_buffer;
            if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b707:
              psVar22->img_buffer = pbVar25 + 1;
              uVar50 = (uint)*pbVar25;
            }
            else {
              if (psVar22->read_from_callbacks != 0) {
                psVar33 = psVar22->buffer_start;
                iVar14 = (*(psVar22->io).read)
                                   (psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
                if (iVar14 == 0) {
                  psVar22->read_from_callbacks = 0;
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar22->buffer_start + 1;
                  psVar22->buffer_start[0] = '\0';
                }
                else {
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar33 + iVar14;
                }
                pbVar25 = psVar22->img_buffer;
                goto LAB_0010b707;
              }
              uVar50 = 0;
            }
            psVar18->spec_end = uVar50;
            psVar22 = psVar18->s;
            pbVar25 = psVar22->img_buffer;
            if (pbVar25 < psVar22->img_buffer_end) {
LAB_0010b78d:
              psVar22->img_buffer = pbVar25 + 1;
              bVar12 = *pbVar25;
            }
            else {
              if (psVar22->read_from_callbacks != 0) {
                psVar33 = psVar22->buffer_start;
                iVar14 = (*(psVar22->io).read)
                                   (psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
                if (iVar14 == 0) {
                  psVar22->read_from_callbacks = 0;
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar22->buffer_start + 1;
                  psVar22->buffer_start[0] = '\0';
                }
                else {
                  psVar22->img_buffer = psVar33;
                  psVar22->img_buffer_end = psVar33 + iVar14;
                }
                pbVar25 = psVar22->img_buffer;
                goto LAB_0010b78d;
              }
              bVar12 = 0;
            }
            psVar18->succ_high = (uint)(bVar12 >> 4);
            uVar50 = bVar12 & 0xf;
            paVar29 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar50;
            psVar18->succ_low = uVar50;
            iVar14 = psVar18->progressive;
            iVar43 = psVar18->spec_start;
            if (iVar14 == 0) {
              if (((iVar43 != 0) || (0xf < bVar12)) || ((bVar12 & 0xf) != 0)) goto LAB_0010ce3b;
              psVar18->spec_end = 0x3f;
            }
            else if (((0x3f < iVar43) || (0x3f < psVar18->spec_end)) ||
                    ((psVar18->spec_end < iVar43 || ((0xdf < bVar12 || (0xd < uVar50)))))) {
LAB_0010ce3b:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_0010d8e0;
            }
            iVar43 = psVar18->scan_n;
            uVar32 = (ulong)(uint)psVar18->restart_interval;
            if (psVar18->restart_interval == 0) {
              uVar32 = 0x7fffffff;
            }
            psVar18->code_buffer = 0;
            psVar18->code_bits = 0;
            psVar18->nomore = 0;
            psVar18->img_comp[3].dc_pred = 0;
            psVar18->img_comp[2].dc_pred = 0;
            psVar18->img_comp[1].dc_pred = 0;
            psVar18->img_comp[0].dc_pred = 0;
            psVar18->marker = 0xff;
            uVar50 = (uint)uVar32;
            psVar18->todo = uVar50;
            psVar18->eob_run = 0;
            if (iVar14 == 0) {
              if (iVar43 == 1) {
                iVar43 = psVar18->order[0];
                uVar27 = psVar18->img_comp[iVar43].y + 7 >> 3;
                local_8950 = (ulong)uVar27;
                if (0 < (int)uVar27) {
                  uVar16 = paVar1[iVar43].x + 7 >> 3;
                  iVar42 = 0;
                  uVar28 = 0;
                  iVar14 = local_8980;
                  do {
                    if (0 < (int)uVar16) {
                      lVar19 = 0;
                      do {
                        iVar38 = stbi__jpeg_decode_block
                                           (psVar18,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar18->huff_dc[paVar1[iVar43].hd].fast,
                                            (stbi__huffman *)
                                            psVar18->huff_ac[paVar1[iVar43].ha].fast,
                                            psVar18->fast_ac[paVar1[iVar43].ha],iVar43,
                                            psVar18->dequant[paVar1[iVar43].tq]);
                        if (iVar38 == 0) {
                          bVar51 = false;
                          iVar14 = 0;
                          uVar32 = extraout_RDX_07;
                        }
                        else {
                          (*psVar18->idct_block_kernel)
                                    (paVar1[iVar43].data + lVar19 + iVar42 * paVar1[iVar43].w2,
                                     paVar1[iVar43].w2,(short *)&local_88a8);
                          iVar38 = psVar18->todo;
                          psVar18->todo = iVar38 + -1;
                          bVar51 = true;
                          uVar32 = extraout_RDX_08;
                          if (iVar38 < 2) {
                            if (psVar18->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar18);
                              uVar32 = extraout_RDX_09;
                            }
                            if ((psVar18->marker & 0xf8) == 0xd0) {
                              psVar18->code_buffer = 0;
                              psVar18->code_bits = 0;
                              psVar18->nomore = 0;
                              psVar18->img_comp[3].dc_pred = 0;
                              psVar18->img_comp[2].dc_pred = 0;
                              psVar18->img_comp[1].dc_pred = 0;
                              psVar18->img_comp[0].dc_pred = 0;
                              psVar18->marker = 0xff;
                              iVar38 = psVar18->restart_interval;
                              uVar32 = 0x7fffffff;
                              if (iVar38 == 0) {
                                iVar38 = 0x7fffffff;
                              }
                              psVar18->todo = iVar38;
                              psVar18->eob_run = 0;
                            }
                            else {
                              iVar14 = 1;
                              bVar51 = false;
                            }
                          }
                        }
                        uVar50 = (uint)uVar32;
                        local_8980 = iVar14;
                        if (!bVar51) goto LAB_0010c804;
                        lVar19 = lVar19 + 8;
                      } while ((ulong)uVar16 * 8 != lVar19);
                    }
                    uVar50 = (uint)uVar32;
                    uVar28 = uVar28 + 1;
                    iVar42 = iVar42 + 8;
                    local_8980 = iVar14;
                  } while (uVar28 != uVar27);
                }
LAB_0010c595:
                iVar14 = 1;
              }
              else {
                iVar14 = 1;
                if (0 < psVar18->img_mcu_y) {
                  iVar43 = 0;
                  do {
                    if (0 < psVar18->img_mcu_x) {
                      local_8980 = 0;
                      do {
                        if (0 < psVar18->scan_n) {
                          uVar31 = 0;
                          do {
                            local_8950 = uVar31;
                            iVar14 = psVar18->order[local_8950];
                            if (0 < psVar18->img_comp[iVar14].v) {
                              iVar42 = 0;
                              bVar51 = true;
                              do {
                                iVar38 = paVar1[iVar14].h;
                                if (0 < iVar38) {
                                  iVar39 = 0;
                                  do {
                                    iVar49 = paVar1[iVar14].v;
                                    iVar17 = stbi__jpeg_decode_block
                                                       (psVar18,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar18->huff_dc[paVar1[iVar14].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar18->huff_ac[paVar1[iVar14].ha].fast,
                                                        psVar18->fast_ac[paVar1[iVar14].ha],iVar14,
                                                        psVar18->dequant[paVar1[iVar14].tq]);
                                    uVar50 = (uint)extraout_RDX_11;
                                    if (iVar17 == 0) {
                                      uVar32 = extraout_RDX_11;
                                      if (bVar51) goto LAB_0010c7ec;
                                      goto LAB_0010c6f9;
                                    }
                                    (*psVar18->idct_block_kernel)
                                              (paVar1[iVar14].data +
                                               (long)((iVar38 * local_8980 + iVar39) * 8) +
                                               (long)((iVar49 * iVar43 + iVar42) * paVar1[iVar14].w2
                                                     * 8),paVar1[iVar14].w2,(short *)&local_88a8);
                                    iVar39 = iVar39 + 1;
                                    iVar38 = paVar1[iVar14].h;
                                    uVar32 = extraout_RDX_12;
                                  } while (iVar39 < iVar38);
                                }
                                iVar42 = iVar42 + 1;
                                bVar51 = iVar42 < paVar1[iVar14].v;
                              } while (iVar42 < paVar1[iVar14].v);
                            }
LAB_0010c6f9:
                            uVar31 = local_8950 + 1;
                          } while ((long)(local_8950 + 1) < (long)psVar18->scan_n);
                        }
                        uVar50 = (uint)uVar32;
                        iVar42 = psVar18->todo;
                        psVar18->todo = iVar42 + -1;
                        iVar14 = 1;
                        if (iVar42 < 2) {
                          if (psVar18->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar18);
                            uVar50 = extraout_EDX_02;
                          }
                          if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_0010c804;
                          psVar18->code_buffer = 0;
                          psVar18->code_bits = 0;
                          psVar18->nomore = 0;
                          psVar18->img_comp[3].dc_pred = 0;
                          psVar18->img_comp[2].dc_pred = 0;
                          psVar18->img_comp[1].dc_pred = 0;
                          psVar18->img_comp[0].dc_pred = 0;
                          psVar18->marker = 0xff;
                          iVar14 = psVar18->restart_interval;
                          uVar32 = 0x7fffffff;
                          if (iVar14 == 0) {
                            iVar14 = 0x7fffffff;
                          }
                          psVar18->todo = iVar14;
                          psVar18->eob_run = 0;
                        }
                        local_8980 = local_8980 + 1;
                      } while (local_8980 < psVar18->img_mcu_x);
                    }
                    uVar50 = (uint)uVar32;
                    iVar14 = 1;
                    iVar43 = iVar43 + 1;
                  } while (iVar43 < psVar18->img_mcu_y);
                }
              }
            }
            else if (iVar43 == 1) {
              local_88c0 = (ulong)psVar18->order[0];
              local_88ec = psVar18->img_comp[local_88c0].y + 7 >> 3;
              iVar14 = 1;
              if (0 < (int)local_88ec) {
                paVar29 = paVar1 + local_88c0;
                iVar43 = psVar18->img_comp[local_88c0].x + 7 >> 3;
                local_8944 = 0;
                local_88d8 = paVar29;
                do {
                  if (0 < iVar43) {
                    iVar14 = 0;
                    do {
                      piVar46 = local_88e0;
                      psVar35 = paVar29->coeff +
                                (int)((paVar29->coeff_w * local_8944 + iVar14) * 0x40);
                      uVar31 = (ulong)psVar18->spec_start;
                      if (uVar31 == 0) {
                        iVar42 = stbi__jpeg_decode_block_prog_dc
                                           (psVar18,psVar35,
                                            (stbi__huffman *)psVar18->huff_dc[paVar29->hd].fast,
                                            (int)local_88c0);
                        uVar32 = extraout_RDX_03;
                        if (iVar42 != 0) goto LAB_0010bde6;
                        bVar51 = false;
                        local_8950 = 0;
                      }
                      else {
                        lVar19 = (long)paVar29->ha;
                        local_8980 = psVar18->succ_low;
                        iVar42 = psVar18->eob_run;
                        bVar12 = (byte)local_8980;
                        if (psVar18->succ_high == 0) {
                          if (iVar42 == 0) {
                            do {
                              if (psVar18->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar18);
                              }
                              sVar48 = psVar18->fast_ac[lVar19][psVar18->code_buffer >> 0x17];
                              uVar50 = (uint)sVar48;
                              iVar42 = (int)uVar31;
                              if (sVar48 == 0) {
                                if (psVar18->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar18);
                                }
                                uVar50 = psVar18->code_buffer;
                                uVar41 = (ulong)uVar50;
                                uVar32 = (ulong)psVar18->huff_ac[lVar19].fast[uVar50 >> 0x17];
                                if (uVar32 == 0xff) {
                                  lVar26 = 0;
                                  do {
                                    lVar36 = lVar26;
                                    lVar26 = lVar36 + 1;
                                  } while ((uint)piVar46[lVar19 * 0x1a4 + lVar36 + -0x11] <=
                                           uVar50 >> 0x10);
                                  iVar38 = psVar18->code_bits;
                                  if (lVar26 == 8) {
                                    psVar18->code_bits = iVar38 + -0x10;
                                    uVar40 = 0xffffffff;
                                  }
                                  else {
                                    uVar40 = 0xffffffff;
                                    if ((int)(lVar36 + 10) <= iVar38) {
                                      iVar39 = (uVar50 >> (0x17U - (char)lVar26 & 0x1f) &
                                               stbi__bmask[lVar36 + 10]) +
                                               piVar46[lVar19 * 0x1a4 + lVar26];
                                      bVar2 = psVar18->huff_ac[lVar19].size[iVar39];
                                      if ((uVar50 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                          (uint)psVar18->huff_ac[lVar19].code[iVar39])
                                      goto LAB_0010e864;
                                      uVar50 = uVar50 << ((byte)(lVar36 + 10) & 0x1f);
                                      uVar41 = (ulong)uVar50;
                                      psVar18->code_bits = (iVar38 - (int)lVar26) + -9;
                                      psVar18->code_buffer = uVar50;
                                      uVar40 = (ulong)psVar18->huff_ac[lVar19].values[iVar39];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar18->huff_ac[lVar19].size[uVar32];
                                  uVar40 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                    uVar50 = uVar50 << (bVar2 & 0x1f);
                                    uVar41 = (ulong)uVar50;
                                    psVar18->code_buffer = uVar50;
                                    psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                    uVar40 = (ulong)psVar18->huff_ac[lVar19].values[uVar32];
                                  }
                                }
                                uVar50 = (uint)uVar40;
                                if ((int)uVar50 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar42 = 1;
                                  uVar32 = 0;
                                }
                                else {
                                  uVar32 = uVar40 >> 4;
                                  uVar27 = uVar50 & 0xf;
                                  if ((uVar40 & 0xf) == 0) {
                                    if (uVar50 < 0xf0) {
                                      psVar18->eob_run = 1 << ((byte)uVar32 & 0x1f);
                                      if (0xf < uVar50) {
                                        if (psVar18->code_bits < (int)uVar32) {
                                          stbi__grow_buffer_unsafe(psVar18);
                                        }
                                        bVar2 = (byte)uVar32 & 0x1f;
                                        uVar27 = psVar18->code_buffer << bVar2 |
                                                 psVar18->code_buffer >> 0x20 - bVar2;
                                        uVar50 = stbi__bmask[uVar32];
                                        psVar18->code_buffer = ~uVar50 & uVar27;
                                        psVar18->code_bits = psVar18->code_bits - (int)uVar32;
                                        psVar18->eob_run = psVar18->eob_run + (uVar27 & uVar50);
                                      }
                                      psVar18->eob_run = psVar18->eob_run + -1;
                                      iVar42 = 2;
                                      uVar32 = 0;
                                      goto LAB_0010c1d7;
                                    }
                                    uVar50 = iVar42 + 0x10;
                                  }
                                  else {
                                    bVar2 = ""[(long)iVar42 + uVar32];
                                    if (psVar18->code_bits < (int)uVar27) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                    }
                                    uVar50 = psVar18->code_buffer;
                                    uVar28 = uVar50 << (sbyte)uVar27 |
                                             uVar50 >> 0x20 - (sbyte)uVar27;
                                    uVar16 = *(uint *)((long)stbi__bmask + (ulong)(uVar27 * 4));
                                    psVar18->code_buffer = ~uVar16 & uVar28;
                                    psVar18->code_bits = psVar18->code_bits - uVar27;
                                    iVar38 = 0;
                                    if (-1 < (int)uVar50) {
                                      iVar38 = *(int *)((long)stbi__jbias + (ulong)(uVar27 * 4));
                                    }
                                    uVar27 = (uVar28 & uVar16) + iVar38 << (bVar12 & 0x1f);
                                    uVar41 = (ulong)uVar27;
                                    uVar50 = (int)((long)iVar42 + uVar32) + 1;
                                    psVar35[bVar2] = (short)uVar27;
                                  }
                                  iVar42 = 0;
                                  uVar31 = (ulong)uVar50;
                                  uVar32 = CONCAT71((int7)(uVar41 >> 8),1);
                                }
                              }
                              else {
                                psVar18->code_buffer = psVar18->code_buffer << (sbyte)(uVar50 & 0xf)
                                ;
                                psVar18->code_bits = psVar18->code_bits - (uVar50 & 0xf);
                                lVar26 = (long)iVar42 + (ulong)(uVar50 >> 4 & 0xf);
                                uVar31 = (ulong)((int)lVar26 + 1);
                                psVar35[""[lVar26]] = (short)((uVar50 >> 8) << (bVar12 & 0x1f));
                                iVar42 = 0 << (bVar12 & 0x1f);
                                uVar32 = 1;
                              }
LAB_0010c1d7:
                              bVar51 = false;
                              uVar41 = 1;
                              if (iVar42 != 0) {
                                if (iVar42 != 2) {
                                  uVar41 = uVar32;
                                }
                                break;
                              }
                            } while ((int)uVar31 <= psVar18->spec_end);
                          }
                          else {
                            psVar18->eob_run = iVar42 + -1;
                            bVar51 = true;
                            uVar41 = 0;
                          }
                          if ((char)uVar41 != '\0') goto LAB_0010bdbc;
                        }
                        else {
                          if (iVar42 == 0) {
                            uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                            do {
                              if (psVar18->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar18);
                              }
                              uVar27 = psVar18->code_buffer;
                              uVar32 = (ulong)uVar27;
                              uVar41 = (ulong)psVar18->huff_ac[lVar19].fast[uVar27 >> 0x17];
                              if (uVar41 == 0xff) {
                                lVar26 = 0;
                                do {
                                  lVar36 = lVar26;
                                  lVar26 = lVar36 + 1;
                                } while ((uint)piVar46[lVar19 * 0x1a4 + lVar36 + -0x11] <=
                                         uVar27 >> 0x10);
                                iVar42 = psVar18->code_bits;
                                if (lVar26 == 8) {
                                  psVar18->code_bits = iVar42 + -0x10;
                                  uVar40 = 0xffffffff;
                                }
                                else {
                                  uVar40 = 0xffffffff;
                                  if ((int)(lVar36 + 10) <= iVar42) {
                                    iVar38 = (uVar27 >> (0x17U - (char)lVar26 & 0x1f) &
                                             stbi__bmask[lVar36 + 10]) +
                                             piVar46[lVar19 * 0x1a4 + lVar26];
                                    bVar2 = psVar18->huff_ac[lVar19].size[iVar38];
                                    if ((uVar27 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)psVar18->huff_ac[lVar19].code[iVar38]) {
LAB_0010e864:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/stb_image.h"
                                                  ,0x7a0,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar27 = uVar27 << ((byte)(lVar36 + 10) & 0x1f);
                                    uVar32 = (ulong)uVar27;
                                    psVar18->code_bits = (iVar42 - (int)lVar26) + -9;
                                    psVar18->code_buffer = uVar27;
                                    uVar40 = (ulong)psVar18->huff_ac[lVar19].values[iVar38];
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar18->huff_ac[lVar19].size[uVar41];
                                uVar40 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar18->code_bits) {
                                  uVar27 = uVar27 << (bVar2 & 0x1f);
                                  uVar32 = (ulong)uVar27;
                                  psVar18->code_buffer = uVar27;
                                  psVar18->code_bits = psVar18->code_bits - (uint)bVar2;
                                  uVar40 = (ulong)psVar18->huff_ac[lVar19].values[uVar41];
                                }
                              }
                              uVar27 = (uint)uVar40;
                              if ((int)uVar27 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar51 = false;
                              }
                              else {
                                uVar41 = uVar40 >> 4;
                                if ((uVar27 & 0xf) == 1) {
                                  if (psVar18->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar18);
                                    uVar32 = extraout_RDX_04;
                                  }
                                  uVar27 = psVar18->code_buffer;
                                  psVar18->code_buffer = uVar27 * 2;
                                  psVar18->code_bits = psVar18->code_bits + -1;
                                  sVar48 = (short)(((int)~uVar27 >> 0x1f | 1U) << (bVar12 & 0x1f));
                                }
                                else {
                                  if ((uVar40 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar51 = false;
                                    goto LAB_0010bda7;
                                  }
                                  if (uVar27 < 0xf0) {
                                    psVar18->eob_run = ~(-1 << ((byte)uVar41 & 0x1f));
                                    if (0xf < uVar27) {
                                      if (psVar18->code_bits < (int)uVar41) {
                                        stbi__grow_buffer_unsafe(psVar18);
                                      }
                                      bVar2 = (byte)uVar41 & 0x1f;
                                      uVar16 = psVar18->code_buffer << bVar2 |
                                               psVar18->code_buffer >> 0x20 - bVar2;
                                      uVar27 = stbi__bmask[uVar41];
                                      uVar28 = ~uVar27 & uVar16;
                                      uVar32 = (ulong)uVar28;
                                      psVar18->code_buffer = uVar28;
                                      psVar18->code_bits = psVar18->code_bits - (int)uVar41;
                                      psVar18->eob_run = psVar18->eob_run + (uVar16 & uVar27);
                                    }
                                    sVar48 = 0;
                                    uVar41 = 0x40;
                                  }
                                  else {
                                    sVar48 = 0;
                                    uVar41 = 0xf;
                                  }
                                }
                                uVar31 = (ulong)(int)uVar31;
                                do {
                                  if ((long)psVar18->spec_end < (long)uVar31) break;
                                  bVar2 = ""[uVar31];
                                  if (psVar35[bVar2] == 0) {
                                    if ((int)uVar41 == 0) {
                                      psVar35[bVar2] = sVar48;
                                      bVar51 = false;
                                      uVar41 = 0;
                                    }
                                    else {
                                      uVar41 = (ulong)((int)uVar41 - 1);
                                      bVar51 = true;
                                    }
                                  }
                                  else {
                                    if (psVar18->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar18);
                                      uVar32 = extraout_RDX_05;
                                    }
                                    sVar15 = psVar18->code_buffer;
                                    psVar18->code_buffer = sVar15 * 2;
                                    psVar18->code_bits = psVar18->code_bits + -1;
                                    bVar51 = true;
                                    if (((int)sVar15 < 0) &&
                                       (sVar3 = psVar35[bVar2], (uVar50 & (int)sVar3) == 0)) {
                                      uVar27 = uVar50;
                                      if (sVar3 < 1) {
                                        uVar27 = -uVar50;
                                      }
                                      psVar35[bVar2] = sVar3 + (short)uVar27;
                                    }
                                  }
                                  uVar31 = uVar31 + 1;
                                } while (bVar51);
                                bVar51 = true;
                              }
LAB_0010bda7:
                              if (!bVar51) {
                                bVar51 = false;
                                goto LAB_0010bdc1;
                              }
                            } while ((int)uVar31 <= psVar18->spec_end);
                          }
                          else {
                            psVar18->eob_run = iVar42 + -1;
                            if (psVar18->spec_start <= psVar18->spec_end) {
                              uVar50 = (0x10000 << (bVar12 & 0x1f)) >> 0x10;
                              do {
                                bVar12 = ""[uVar31];
                                if (psVar35[bVar12] != 0) {
                                  if (psVar18->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar18);
                                    uVar32 = extraout_RDX_02;
                                  }
                                  sVar15 = psVar18->code_buffer;
                                  psVar18->code_buffer = sVar15 * 2;
                                  psVar18->code_bits = psVar18->code_bits + -1;
                                  if (((int)sVar15 < 0) &&
                                     (sVar48 = psVar35[bVar12], (uVar50 & (int)sVar48) == 0)) {
                                    uVar27 = -uVar50;
                                    if (0 < sVar48) {
                                      uVar27 = uVar50;
                                    }
                                    psVar35[bVar12] = (short)uVar27 + sVar48;
                                  }
                                }
                                bVar51 = (long)uVar31 < (long)psVar18->spec_end;
                                uVar31 = uVar31 + 1;
                              } while (bVar51);
                            }
                          }
LAB_0010bdbc:
                          bVar51 = true;
                        }
LAB_0010bdc1:
                        if (!bVar51) {
                          local_8950._0_4_ = 0;
                        }
                        local_8950 = (ulong)(uint)local_8950;
                        paVar29 = local_88d8;
                        if (!bVar51) {
                          bVar51 = false;
                        }
                        else {
LAB_0010bde6:
                          iVar42 = psVar18->todo;
                          psVar18->todo = iVar42 + -1;
                          bVar51 = true;
                          if (iVar42 < 2) {
                            if (psVar18->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar18);
                              uVar32 = extraout_RDX_06;
                            }
                            if ((psVar18->marker & 0xf8) == 0xd0) {
                              psVar18->code_buffer = 0;
                              psVar18->code_bits = 0;
                              psVar18->nomore = 0;
                              psVar18->img_comp[3].dc_pred = 0;
                              psVar18->img_comp[2].dc_pred = 0;
                              psVar18->img_comp[1].dc_pred = 0;
                              psVar18->img_comp[0].dc_pred = 0;
                              psVar18->marker = 0xff;
                              iVar42 = psVar18->restart_interval;
                              uVar32 = 0x7fffffff;
                              if (iVar42 == 0) {
                                iVar42 = 0x7fffffff;
                              }
                              psVar18->todo = iVar42;
                              psVar18->eob_run = 0;
                            }
                            else {
                              local_8950 = 1;
                              bVar51 = false;
                            }
                          }
                        }
                      }
                      uVar50 = (uint)uVar32;
                      if (!bVar51) {
                        iVar14 = (int)local_8950;
                        goto LAB_0010c804;
                      }
                      iVar14 = iVar14 + 1;
                    } while (iVar14 != iVar43);
                  }
                  uVar50 = (uint)uVar32;
                  iVar14 = 1;
                  local_8944 = local_8944 + 1;
                } while (local_8944 != local_88ec);
              }
            }
            else {
              iVar14 = 1;
              if (0 < psVar18->img_mcu_y) {
                iVar14 = 0;
                do {
                  if (0 < psVar18->img_mcu_x) {
                    iVar43 = 0;
                    do {
                      if (0 < psVar18->scan_n) {
                        lVar19 = 0;
                        do {
                          iVar42 = psVar18->order[lVar19];
                          if (0 < psVar18->img_comp[iVar42].v) {
                            iVar38 = 0;
                            bVar51 = true;
                            do {
                              iVar39 = paVar1[iVar42].h;
                              if (0 < iVar39) {
                                iVar49 = 0;
                                do {
                                  iVar39 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar18,paVar1[iVar42].coeff +
                                                              (iVar39 * iVar43 + iVar49 +
                                                              (paVar1[iVar42].v * iVar14 + iVar38) *
                                                              paVar1[iVar42].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar18->huff_dc[paVar1[iVar42].hd].fast,
                                                      iVar42);
                                  uVar50 = (uint)extraout_RDX_10;
                                  uVar32 = extraout_RDX_10;
                                  if (iVar39 == 0) {
                                    if (bVar51) goto LAB_0010c7ec;
                                    goto LAB_0010c4c8;
                                  }
                                  iVar49 = iVar49 + 1;
                                  iVar39 = paVar1[iVar42].h;
                                } while (iVar49 < iVar39);
                              }
                              iVar38 = iVar38 + 1;
                              bVar51 = iVar38 < paVar1[iVar42].v;
                            } while (iVar38 < paVar1[iVar42].v);
                          }
LAB_0010c4c8:
                          lVar19 = lVar19 + 1;
                        } while (lVar19 < psVar18->scan_n);
                      }
                      uVar50 = (uint)uVar32;
                      iVar42 = psVar18->todo;
                      psVar18->todo = iVar42 + -1;
                      if (iVar42 < 2) {
                        if (psVar18->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar18);
                          uVar50 = extraout_EDX_01;
                        }
                        if ((psVar18->marker & 0xf8) != 0xd0) goto LAB_0010c595;
                        psVar18->code_buffer = 0;
                        psVar18->code_bits = 0;
                        psVar18->nomore = 0;
                        psVar18->img_comp[3].dc_pred = 0;
                        psVar18->img_comp[2].dc_pred = 0;
                        psVar18->img_comp[1].dc_pred = 0;
                        psVar18->img_comp[0].dc_pred = 0;
                        psVar18->marker = 0xff;
                        iVar42 = psVar18->restart_interval;
                        uVar32 = 0x7fffffff;
                        if (iVar42 == 0) {
                          iVar42 = 0x7fffffff;
                        }
                        psVar18->todo = iVar42;
                        psVar18->eob_run = 0;
                      }
                      iVar43 = iVar43 + 1;
                    } while (iVar43 < psVar18->img_mcu_x);
                  }
                  uVar50 = (uint)uVar32;
                  iVar14 = iVar14 + 1;
                } while (iVar14 < psVar18->img_mcu_y);
                goto LAB_0010c595;
              }
            }
            goto LAB_0010c804;
          }
          stbi__g_failure_reason = "bad SOS component count";
LAB_0010d8e0:
          uVar50 = (uint)paVar29;
        }
        else {
          if (bVar12 == 0xdc) {
            iVar14 = stbi__get16be(psVar18->s);
            sVar15 = stbi__get16be(psVar18->s);
            paVar29 = extraout_RDX;
            if (iVar14 == 4) {
              if (sVar15 == psVar18->s->img_y) goto LAB_0010c816;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_0010d8e0;
          }
          if (bVar12 == 0xd9) {
            if ((psVar18->progressive != 0) && (0 < psVar18->s->img_n)) {
              lVar19 = 0;
              do {
                iVar14 = psVar18->img_comp[lVar19].y + 7 >> 3;
                if (0 < iVar14) {
                  uVar50 = paVar1[lVar19].x + 7 >> 3;
                  iVar43 = 0;
                  do {
                    if (0 < (int)uVar50) {
                      uVar32 = 0;
                      do {
                        psVar35 = paVar1[lVar19].coeff +
                                  (paVar1[lVar19].coeff_w * iVar43 + (int)uVar32) * 0x40;
                        iVar42 = paVar1[lVar19].tq;
                        lVar26 = 0;
                        do {
                          psVar35[lVar26] = psVar35[lVar26] * psVar18->dequant[iVar42][lVar26];
                          lVar26 = lVar26 + 1;
                        } while (lVar26 != 0x40);
                        (*psVar18->idct_block_kernel)
                                  (paVar1[lVar19].data +
                                   uVar32 * 8 + (long)(iVar43 * 8 * paVar1[lVar19].w2),
                                   paVar1[lVar19].w2,psVar35);
                        uVar32 = uVar32 + 1;
                      } while (uVar32 != uVar50);
                    }
                    iVar43 = iVar43 + 1;
                  } while (iVar43 != iVar14);
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 < psVar18->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar18->s->img_n) * 2 + 1;
            }
            uVar50 = psVar18->s->img_n;
            if (uVar50 == 3) {
              bVar51 = true;
              if (psVar18->rgb != 3) {
                if (psVar18->app14_color_transform != 0) goto LAB_0010d057;
                bVar51 = psVar18->jfif == 0;
              }
            }
            else {
LAB_0010d057:
              bVar51 = false;
            }
            uVar27 = 1;
            if (bVar51) {
              uVar27 = uVar50;
            }
            if (2 < req_comp) {
              uVar27 = uVar50;
            }
            if (uVar50 != 3) {
              uVar27 = uVar50;
            }
            local_8918 = (stbi_uc *)0x0;
            uStack_8910 = (stbi_uc *)0x0;
            local_8928 = (undefined1  [8])0x0;
            uStack_8920 = (stbi_uc *)0x0;
            if ((int)uVar27 < 1) {
LAB_0010d1d7:
              psVar47 = psVar18->s;
              sVar15 = psVar47->img_y;
              psVar22 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar47->img_x,sVar15,1);
              iVar14 = (int)extraout_RDX_13;
              if (psVar22 != (stbi__context *)0x0) {
                if (sVar15 != 0) {
                  iVar43 = 0;
                  uVar50 = 0;
                  auVar30 = (undefined1  [8])extraout_RDX_13;
                  do {
                    sVar15 = psVar47->img_x;
                    if (0 < (int)uVar27) {
                      pasVar45 = (stbi_uc (*) [4])&local_88a8.ratio;
                      uVar32 = 0;
                      piVar46 = &psVar18->img_comp[0].y;
                      do {
                        asVar5 = pasVar45[-1];
                        asVar6 = pasVar45[-3];
                        iVar14 = (int)asVar6 >> 1;
                        auVar52 = (**(code **)(pasVar45 + -10))
                                            (*(stbi_uc **)(piVar46 + 10),
                                             *(undefined8 *)
                                              (*pasVar45 +
                                              ((ulong)(iVar14 <= (int)asVar5) << 3 |
                                              0xffffffffffffffe0)),
                                             *(undefined8 *)
                                              (*pasVar45 +
                                              ((ulong)((int)asVar5 < iVar14) << 3 |
                                              0xffffffffffffffe0)),pasVar45[-2]);
                        auVar30 = auVar52._8_8_;
                        *(long *)(local_8928 + uVar32 * 8) = auVar52._0_8_;
                        pasVar45[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar6 <= (int)asVar5 + 1) {
                          pasVar45[-1] = (stbi_uc  [4])0x0;
                          *(stbi_uc **)(pasVar45 + -8) = *(stbi_uc **)(pasVar45 + -6);
                          asVar5 = *pasVar45;
                          *pasVar45 = (stbi_uc  [4])((int)asVar5 + 1);
                          if ((int)asVar5 + 1 < *piVar46) {
                            *(stbi_uc **)(pasVar45 + -6) = *(stbi_uc **)(pasVar45 + -6) + piVar46[1]
                            ;
                          }
                        }
                        uVar32 = uVar32 + 1;
                        piVar46 = piVar46 + 0x18;
                        pasVar45 = pasVar45 + 0xc;
                      } while (uVar27 != uVar32);
                    }
                    if (req_comp < 3) {
                      psVar47 = psVar18->s;
                      if (bVar51) {
                        if (req_comp == 1) {
                          if (psVar47->img_x != 0) {
                            uVar32 = 0;
                            do {
                              bVar12 = local_8918[uVar32];
                              psVar22->buffer_start[uVar32 + sVar15 * iVar43 + -0x38] =
                                   (stbi_uc)((uint)bVar12 * 2 +
                                             ((uint)bVar12 + (uint)bVar12 * 8) * 3 +
                                             (uint)uStack_8920[uVar32] * 0x96 +
                                             (uint)*(byte *)((long)local_8928 + uVar32) * 0x4d >> 8)
                              ;
                              uVar32 = uVar32 + 1;
                              auVar30 = (undefined1  [8])uStack_8920;
                            } while (uVar32 < psVar47->img_x);
                          }
                        }
                        else if (psVar47->img_x != 0) {
                          uVar32 = 0;
                          do {
                            bVar12 = local_8918[uVar32];
                            psVar22->buffer_start[uVar32 * 2 + (ulong)(sVar15 * iVar43) + -0x38] =
                                 (stbi_uc)((uint)bVar12 * 2 + ((uint)bVar12 + (uint)bVar12 * 8) * 3
                                           + (uint)uStack_8920[uVar32] * 0x96 +
                                             (uint)*(byte *)((long)local_8928 + uVar32) * 0x4d >> 8)
                            ;
                            psVar22->buffer_start[uVar32 * 2 + (ulong)(sVar15 * iVar43) + -0x37] =
                                 0xff;
                            uVar32 = uVar32 + 1;
                            auVar30 = (undefined1  [8])uStack_8920;
                          } while (uVar32 < psVar47->img_x);
                        }
                      }
                      else if (psVar47->img_n == 4) {
                        if (psVar18->app14_color_transform == 2) {
                          if (psVar47->img_x != 0) {
                            psVar33 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x37);
                            uVar32 = 0;
                            do {
                              iVar14 = (*(byte *)((long)local_8928 + uVar32) ^ 0xff) *
                                       (uint)uStack_8910[uVar32];
                              psVar33[-1] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              *psVar33 = 0xff;
                              uVar32 = uVar32 + 1;
                              psVar33 = psVar33 + (uint)req_comp;
                              auVar30 = (undefined1  [8])uStack_8910;
                            } while (uVar32 < psVar47->img_x);
                          }
                        }
                        else {
                          if (psVar18->app14_color_transform != 0) goto LAB_0010d619;
                          if (psVar47->img_x != 0) {
                            psVar33 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x37);
                            uVar32 = 0;
                            do {
                              bVar12 = uStack_8910[uVar32];
                              iVar14 = (uint)*(byte *)((long)local_8928 + uVar32) * (uint)bVar12;
                              iVar42 = (uint)uStack_8920[uVar32] * (uint)bVar12;
                              psVar33[-1] = (char)(((uint)local_8918[uVar32] * (uint)bVar12 +
                                                    ((uint)local_8918[uVar32] * (uint)bVar12 + 0x80
                                                    >> 8) + 0x80 >> 8 & 0xff) * 0x1d +
                                                   (iVar42 + (iVar42 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x96 +
                                                   (iVar14 + (iVar14 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x4d >> 8);
                              *psVar33 = 0xff;
                              uVar32 = uVar32 + 1;
                              psVar33 = psVar33 + (uint)req_comp;
                              auVar30 = local_8928;
                            } while (uVar32 < psVar47->img_x);
                          }
                        }
                      }
                      else {
LAB_0010d619:
                        uVar16 = psVar47->img_x;
                        auVar30 = (undefined1  [8])(ulong)uVar16;
                        if (req_comp == 1) {
                          if (uVar16 != 0) {
                            auVar30 = (undefined1  [8])0x0;
                            do {
                              (psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x38))
                              [(long)auVar30] = *(stbi_uc *)((long)local_8928 + (long)auVar30);
                              auVar30 = (undefined1  [8])((long)auVar30 + 1);
                            } while ((ulong)auVar30 < (stbi_uc *)(ulong)psVar47->img_x);
                          }
                        }
                        else if (uVar16 != 0) {
                          auVar30 = (undefined1  [8])0x0;
                          do {
                            psVar22->buffer_start
                            [(long)auVar30 * 2 + (ulong)(sVar15 * iVar43) + -0x38] =
                                 *(stbi_uc *)((long)local_8928 + (long)auVar30);
                            psVar22->buffer_start
                            [(long)auVar30 * 2 + (ulong)(sVar15 * iVar43) + -0x37] = 0xff;
                            auVar30 = (undefined1  [8])((long)auVar30 + 1);
                          } while ((ulong)auVar30 < (stbi_uc *)(ulong)psVar47->img_x);
                        }
                      }
                    }
                    else {
                      psVar47 = psVar18->s;
                      if (psVar47->img_n == 3) {
                        if (bVar51) {
                          if (psVar47->img_x != 0) {
                            psVar33 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x35);
                            uVar32 = 0;
                            do {
                              psVar33[-3] = *(stbi_uc *)((long)local_8928 + uVar32);
                              psVar33[-2] = uStack_8920[uVar32];
                              psVar33[-1] = local_8918[uVar32];
                              *psVar33 = 0xff;
                              uVar32 = uVar32 + 1;
                              psVar33 = psVar33 + (uint)req_comp;
                              auVar30 = (undefined1  [8])local_8918;
                            } while (uVar32 < psVar47->img_x);
                          }
                        }
                        else {
LAB_0010d68e:
                          (*psVar18->YCbCr_to_RGB_kernel)
                                    (psVar22->buffer_start +
                                     ((ulong)(uVar50 * req_comp * sVar15) - 0x38),
                                     (stbi_uc *)local_8928,uStack_8920,local_8918,psVar47->img_x,
                                     req_comp);
                          auVar30 = (undefined1  [8])extraout_RDX_14;
                        }
                      }
                      else if (psVar47->img_n == 4) {
                        if (psVar18->app14_color_transform == 2) {
                          (*psVar18->YCbCr_to_RGB_kernel)
                                    (psVar22->buffer_start +
                                     ((ulong)(uVar50 * req_comp * sVar15) - 0x38),
                                     (stbi_uc *)local_8928,uStack_8920,local_8918,psVar47->img_x,
                                     req_comp);
                          psVar47 = psVar18->s;
                          auVar30 = (undefined1  [8])extraout_RDX_15;
                          if (psVar47->img_x != 0) {
                            psVar33 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x36);
                            auVar30 = (undefined1  [8])0x0;
                            do {
                              bVar12 = uStack_8910[(long)auVar30];
                              iVar14 = (psVar33[-2] ^ 0xff) * (uint)bVar12;
                              psVar33[-2] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (psVar33[-1] ^ 0xff) * (uint)bVar12;
                              psVar33[-1] = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (*psVar33 ^ 0xff) * (uint)bVar12;
                              *psVar33 = (byte)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              auVar30 = (undefined1  [8])((long)auVar30 + 1);
                              psVar33 = psVar33 + (uint)req_comp;
                            } while ((ulong)auVar30 < (stbi_uc *)(ulong)psVar47->img_x);
                          }
                        }
                        else {
                          if (psVar18->app14_color_transform != 0) goto LAB_0010d68e;
                          if (psVar47->img_x != 0) {
                            psVar33 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x35);
                            uVar32 = 0;
                            do {
                              bVar12 = uStack_8910[uVar32];
                              iVar14 = (uint)*(byte *)((long)local_8928 + uVar32) * (uint)bVar12;
                              psVar33[-3] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              iVar14 = (uint)uStack_8920[uVar32] * (uint)bVar12;
                              psVar33[-2] = (char)((iVar14 + 0x80U >> 8) + iVar14 + 0x80 >> 8);
                              psVar33[-1] = (char)(((uint)local_8918[uVar32] * (uint)bVar12 + 0x80
                                                   >> 8) + (uint)local_8918[uVar32] * (uint)bVar12 +
                                                   0x80 >> 8);
                              *psVar33 = 0xff;
                              uVar32 = uVar32 + 1;
                              psVar33 = psVar33 + (uint)req_comp;
                              auVar30 = (undefined1  [8])uStack_8920;
                            } while (uVar32 < psVar47->img_x);
                          }
                        }
                      }
                      else if (psVar47->img_x != 0) {
                        psVar34 = psVar22->buffer_start + ((ulong)(sVar15 * iVar43) - 0x35);
                        psVar33 = (stbi_uc *)0x0;
                        do {
                          sVar11 = *(stbi_uc *)((long)local_8928 + (long)psVar33);
                          psVar34[-1] = sVar11;
                          psVar34[-2] = sVar11;
                          psVar34[-3] = sVar11;
                          *psVar34 = 0xff;
                          psVar33 = psVar33 + 1;
                          auVar30 = (undefined1  [8])(ulong)psVar47->img_x;
                          psVar34 = psVar34 + (uint)req_comp;
                        } while (psVar33 < (ulong)auVar30);
                      }
                    }
                    iVar14 = SUB84(auVar30,0);
                    uVar50 = uVar50 + 1;
                    psVar47 = psVar18->s;
                    iVar43 = iVar43 + req_comp;
                  } while (uVar50 < psVar47->img_y);
                }
                stbi__free_jpeg_components(psVar18,psVar47->img_n,iVar14);
                psVar47 = psVar18->s;
                *local_8900 = psVar47->img_x;
                *local_88f8 = psVar47->img_y;
                if (local_88e8 != (int *)0x0) {
                  *local_88e8 = (uint)(2 < psVar47->img_n) * 2 + 1;
                }
                goto LAB_0010d8fc;
              }
              stbi__free_jpeg_components(psVar18,psVar47->img_n,iVar14);
              stbi__g_failure_reason = "outofmem";
              goto LAB_0010d8f6;
            }
            lVar19 = 0;
            while( true ) {
              psVar22 = psVar18->s;
              sVar15 = psVar22->img_x;
              pvVar20 = malloc((ulong)(sVar15 + 3));
              *(void **)((long)&psVar18->img_comp[0].linebuf + lVar19 * 2) = pvVar20;
              if (pvVar20 == (void *)0x0) {
                stbi__free_jpeg_components(psVar18,psVar22->img_n,why);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar32 = (long)psVar18->img_h_max /
                         (long)*(int *)((long)&psVar18->img_comp[0].h + lVar19 * 2);
                iVar14 = (int)uVar32;
                *(int *)((long)(local_88a8.pal + -7) + lVar19) = iVar14;
                iVar43 = psVar18->img_v_max / *(int *)((long)&psVar18->img_comp[0].v + lVar19 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar19) = iVar43;
                *(int *)((long)(local_88a8.pal + -4) + lVar19) = iVar43 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar19) =
                     (int)((ulong)((sVar15 + iVar14) - 1) / (uVar32 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar19) = 0;
                uVar7 = *(undefined8 *)((long)&psVar18->img_comp[0].data + lVar19 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar19) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar19) = uVar7;
                if ((iVar14 == 1) && (iVar43 == 1)) {
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar19) =
                       resample_row_1;
                }
                else {
                  if ((iVar14 == 1) && (iVar43 == 2)) {
                    pcVar21 = stbi__resample_row_v_2;
                  }
                  else if ((iVar14 == 2) && (iVar43 == 1)) {
                    pcVar21 = stbi__resample_row_h_2;
                  }
                  else if ((iVar14 == 2) && (iVar43 == 2)) {
                    pcVar21 = psVar18->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar21 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar19) = pcVar21;
                }
              }
              psVar22 = (stbi__context *)0x0;
              if (pvVar20 == (void *)0x0) break;
              lVar19 = lVar19 + 0x30;
              if ((ulong)uVar27 * 0x30 == lVar19) goto LAB_0010d1d7;
            }
            goto LAB_0010d8fc;
          }
          iVar14 = stbi__process_marker(psVar18,(uint)bVar12);
          uVar50 = extraout_EDX_00;
          if (iVar14 != 0) goto LAB_0010c816;
        }
      }
LAB_0010d8e7:
      stbi__free_jpeg_components(psVar18,psVar18->s->img_n,uVar50);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0010d8f6:
    psVar22 = (stbi__context *)0x0;
LAB_0010d8fc:
    free(psVar18);
  }
  else {
    iVar14 = stbi__check_png_header(s);
    psVar34 = s->img_buffer_original;
    s->img_buffer = psVar34;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar14 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar14 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        data_00 = (stbi__uint16 *)local_88a8.history;
        uVar7 = local_88a8._0_8_;
        psVar44 = (stbi__uint16 *)0x0;
        if (iVar14 == 0) goto LAB_0010cb0e;
        iVar14 = 8;
        if (8 < local_88a8.flags) {
          iVar14 = local_88a8.flags;
        }
        ri->bits_per_channel = iVar14;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar14 = *(int *)(local_88a8._0_8_ + 0xc), iVar14 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar14,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar7 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) goto LAB_0010b2d5;
        }
        *local_8900 = *(stbi__uint32 *)local_88a8._0_8_;
        *local_88f8 = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar44 = data_00;
        if (local_88e8 != (int *)0x0) {
          *local_88e8 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_0010cb0e:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar44;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_0010b2d5;
    }
    if (psVar34 < s->img_buffer_original_end) {
LAB_0010ca61:
      s->img_buffer = psVar34 + 1;
      if (*psVar34 != 'B') goto LAB_0010cc9b;
      psVar34 = s->img_buffer;
      if (s->img_buffer_end <= psVar34) {
        if (s->read_from_callbacks == 0) goto LAB_0010cc9b;
        psVar34 = s->buffer_start;
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar34;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar34;
          s->img_buffer_end = psVar34 + iVar14;
        }
        psVar34 = s->img_buffer;
      }
      s->img_buffer = psVar34 + 1;
      if (*psVar34 != 'M') goto LAB_0010cc9b;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar50 = stbi__get16le(s);
      iVar14 = stbi__get16le(s);
      uVar50 = iVar14 << 0x10 | uVar50;
      if ((((0x38 < uVar50) || ((0x100010000001000U >> ((ulong)uVar50 & 0x3f) & 1) == 0)) &&
          (uVar50 != 0x7c)) && (uVar50 != 0x6c)) goto LAB_0010cc9b;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      uStack_8910._4_4_ = 0xff;
      pvVar20 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8928);
      uVar50 = (uint)uStack_8910;
      if (pvVar20 == (void *)0x0) goto LAB_0010b2d5;
      local_88b4 = s->img_y;
      sVar15 = -local_88b4;
      if (0 < (int)local_88b4) {
        sVar15 = local_88b4;
      }
      s->img_y = sVar15;
      if ((int)uStack_8920 == 0xc) {
        if ((int)local_8928._0_4_ < 0x18) {
          uVar32 = (ulong)(uint)((local_8928._4_4_ + -0x26) / 3);
        }
        else {
LAB_0010ce63:
          uVar32 = 0;
        }
      }
      else {
        if (0xf < (int)local_8928._0_4_) goto LAB_0010ce63;
        uVar32 = (ulong)(uint)((local_8928._4_4_ - (int)uStack_8920) + -0xe >> 2);
      }
      local_8938 = uStack_8910._4_4_;
      iVar14 = 4 - (uint)((uint)uStack_8910 == 0);
      s->img_n = iVar14;
      if (2 < req_comp) {
        iVar14 = req_comp;
      }
      sVar4 = s->img_x;
      iVar43 = stbi__mad3sizes_valid(iVar14,sVar4,sVar15,0);
      if (iVar43 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_01 = (uchar *)stbi__malloc_mad3(iVar14,sVar4,sVar15,0);
        if (data_01 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          uVar8 = local_8928._0_4_;
          if ((int)local_8928._0_4_ < 0x10) {
            iVar43 = (int)uVar32;
            if (0x100 < iVar43 || iVar43 == 0) {
              free(data_01);
              stbi__g_failure_reason = "invalid";
              goto LAB_0010b2d5;
            }
            if (0 < iVar43) {
              psVar33 = s->buffer_start;
              psVar34 = s->buffer_start + 1;
              uVar31 = 0;
              do {
                psVar23 = s->img_buffer;
                if (psVar23 < s->img_buffer_end) {
LAB_0010da6c:
                  s->img_buffer = psVar23 + 1;
                  sVar11 = *psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar34;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar33 + iVar42;
                    }
                    psVar23 = s->img_buffer;
                    goto LAB_0010da6c;
                  }
                  sVar11 = '\0';
                }
                local_88a8.pal[uVar31 - 0xd][2] = sVar11;
                psVar23 = s->img_buffer;
                if (psVar23 < s->img_buffer_end) {
LAB_0010daeb:
                  s->img_buffer = psVar23 + 1;
                  sVar11 = *psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar34;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar33 + iVar42;
                    }
                    psVar23 = s->img_buffer;
                    goto LAB_0010daeb;
                  }
                  sVar11 = '\0';
                }
                local_88a8.pal[uVar31 - 0xd][1] = sVar11;
                psVar23 = s->img_buffer;
                if (psVar23 < s->img_buffer_end) {
LAB_0010db6a:
                  s->img_buffer = psVar23 + 1;
                  sVar11 = *psVar23;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar34;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar33 + iVar42;
                    }
                    psVar23 = s->img_buffer;
                    goto LAB_0010db6a;
                  }
                  sVar11 = '\0';
                }
                local_88a8.pal[uVar31 - 0xd][0] = sVar11;
                if ((int)uStack_8920 != 0xc) {
                  psVar23 = s->img_buffer;
                  if (s->img_buffer_end <= psVar23) {
                    if (s->read_from_callbacks == 0) goto LAB_0010dbf6;
                    iVar42 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                    if (iVar42 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar34;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar33;
                      s->img_buffer_end = psVar33 + iVar42;
                    }
                    psVar23 = s->img_buffer;
                  }
                  s->img_buffer = psVar23 + 1;
                }
LAB_0010dbf6:
                local_88a8.pal[uVar31 - 0xd][3] = 0xff;
                uVar31 = uVar31 + 1;
              } while (uVar32 != uVar31);
            }
            stbi__skip(s,(iVar43 * ((int)uStack_8920 == 0xc | 0xfffffffc) - (int)uStack_8920) +
                         local_8928._4_4_ + -0xe);
            if (uVar8 == 8) {
              uVar50 = s->img_x;
            }
            else if (uVar8 == 4) {
              uVar50 = s->img_x + 1 >> 1;
            }
            else {
              if (uVar8 != 1) {
                free(data_01);
                stbi__g_failure_reason = "bad bpp";
                goto LAB_0010b2d5;
              }
              uVar50 = s->img_x + 7 >> 3;
            }
            if (uVar8 == 1) {
              if (0 < (int)s->img_y) {
                local_8968 = -uVar50 & 3;
                psVar33 = s->buffer_start;
                iVar43 = 0;
                iVar42 = 0;
                do {
                  pbVar25 = s->img_buffer;
                  if (pbVar25 < s->img_buffer_end) {
LAB_0010e4be:
                    s->img_buffer = pbVar25 + 1;
                    uVar50 = (uint)*pbVar25;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                      if (iVar38 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar33;
                        s->img_buffer_end = s->buffer_start + 1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar33;
                        s->img_buffer_end = psVar33 + iVar38;
                      }
                      pbVar25 = s->img_buffer;
                      goto LAB_0010e4be;
                    }
                    uVar50 = 0;
                  }
                  uVar27 = 7;
                  sVar15 = 1;
                  do {
                    sVar4 = s->img_x;
                    if ((int)sVar4 <= (int)(sVar15 - 1)) break;
                    uVar32 = (ulong)((uVar50 >> (uVar27 & 0x1f) & 1) != 0);
                    data_01[iVar43] = local_88a8.pal[uVar32 - 0xd][0];
                    data_01[(long)iVar43 + 1] = local_88a8.pal[uVar32 - 0xd][1];
                    data_01[(long)iVar43 + 2] = local_88a8.pal[uVar32 - 0xd][2];
                    iVar38 = iVar43 + 3;
                    if (iVar14 == 4) {
                      data_01[(long)iVar43 + 3] = 0xff;
                      iVar38 = iVar43 + 4;
                    }
                    iVar43 = iVar38;
                    if (sVar15 != sVar4) {
                      if ((int)uVar27 < 1) {
                        pbVar25 = s->img_buffer;
                        if (pbVar25 < s->img_buffer_end) {
LAB_0010e5c4:
                          s->img_buffer = pbVar25 + 1;
                          uVar50 = (uint)*pbVar25;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                            if (iVar38 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar33;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar33;
                              s->img_buffer_end = psVar33 + iVar38;
                            }
                            pbVar25 = s->img_buffer;
                            goto LAB_0010e5c4;
                          }
                          uVar50 = 0;
                        }
                        uVar27 = 7;
                      }
                      else {
                        uVar27 = uVar27 - 1;
                      }
                    }
                    bVar51 = sVar15 != sVar4;
                    sVar15 = sVar15 + 1;
                  } while (bVar51);
                  stbi__skip(s,local_8968);
                  iVar42 = iVar42 + 1;
                } while (iVar42 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              psVar33 = s->buffer_start;
              uVar32 = 0;
              iVar43 = 0;
              local_8968 = -uVar50 & 3;
              do {
                if (0 < (int)s->img_x) {
                  iVar42 = 0;
                  do {
                    iVar38 = (int)uVar32;
                    pbVar25 = s->img_buffer;
                    if (pbVar25 < s->img_buffer_end) {
LAB_0010e6bf:
                      s->img_buffer = pbVar25 + 1;
                      uVar50 = (uint)*pbVar25;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar39 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                        if (iVar39 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar33;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar33;
                          s->img_buffer_end = psVar33 + iVar39;
                        }
                        pbVar25 = s->img_buffer;
                        goto LAB_0010e6bf;
                      }
                      uVar50 = 0;
                    }
                    uVar27 = uVar50 >> 4;
                    if (uVar8 != 4) {
                      uVar27 = uVar50;
                    }
                    uVar32 = (ulong)uVar27;
                    uVar50 = uVar50 & 0xf;
                    if (uVar8 != 4) {
                      uVar50 = 0;
                    }
                    uVar27 = iVar38 + 3;
                    data_01[iVar38] = local_88a8.pal[uVar32 - 0xd][0];
                    data_01[(long)iVar38 + 1] = local_88a8.pal[uVar32 - 0xd][1];
                    data_01[(long)iVar38 + 2] = local_88a8.pal[uVar32 - 0xd][2];
                    if (iVar14 == 4) {
                      uVar27 = iVar38 + 4;
                      data_01[(long)iVar38 + 3] = 0xff;
                    }
                    sVar15 = s->img_x;
                    if (iVar42 + 1U == sVar15) {
LAB_0010e802:
                      uVar32 = (ulong)uVar27;
                    }
                    else {
                      if (uVar8 == 8) {
                        pbVar25 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar25) {
                          if (s->read_from_callbacks == 0) {
                            uVar50 = 0;
                            goto LAB_0010e7be;
                          }
                          iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                          if (iVar38 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar33;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar33;
                            s->img_buffer_end = psVar33 + iVar38;
                          }
                          pbVar25 = s->img_buffer;
                        }
                        s->img_buffer = pbVar25 + 1;
                        uVar50 = (uint)*pbVar25;
                      }
LAB_0010e7be:
                      lVar19 = (long)(int)uVar27;
                      uVar32 = lVar19 + 3;
                      uVar31 = (ulong)uVar50;
                      data_01[lVar19] = local_88a8.pal[uVar31 - 0xd][0];
                      data_01[lVar19 + 1] = local_88a8.pal[uVar31 - 0xd][1];
                      data_01[lVar19 + 2] = local_88a8.pal[uVar31 - 0xd][2];
                      if (iVar14 == 4) {
                        uVar27 = uVar27 + 4;
                        data_01[lVar19 + 3] = 0xff;
                        goto LAB_0010e802;
                      }
                    }
                  } while ((iVar42 + 1U != sVar15) && (iVar42 = iVar42 + 2, iVar42 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_8968);
                iVar43 = iVar43 + 1;
              } while (iVar43 < (int)s->img_y);
            }
          }
          else {
            psVar22 = s;
            stbi__skip(s,(local_8928._4_4_ - (int)uStack_8920) + -0xe);
            if (local_8928._0_4_ == 0x18) {
              iVar43 = -3;
LAB_0010dcb8:
              local_88b0 = iVar43 * s->img_x & 3;
            }
            else {
              local_88b0 = 0;
              if (local_8928._0_4_ == 0x10) {
                iVar43 = -2;
                goto LAB_0010dcb8;
              }
            }
            iVar43 = 0;
            if (local_8928._0_4_ == 0x18) {
              uVar32 = 0;
LAB_0010dd11:
              local_88d8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d8._4_4_ << 0x20);
            }
            else {
              uVar37 = (undefined7)((ulong)psVar22 >> 8);
              if (local_8928._0_4_ != 0x20) {
                uVar32 = CONCAT71(uVar37,1);
                goto LAB_0010dd11;
              }
              uVar27 = uStack_8920._4_4_ ^ 0xff0000 |
                       (uint)local_8918 ^ 0xff00 | local_8918._4_4_ ^ 0xff;
              local_88d8 = (anon_struct_96_18_0d0905d3 *)
                           CONCAT44(local_88d8._4_4_,
                                    CONCAT31((int3)(uVar27 >> 8),uVar50 == 0xff000000 && uVar27 == 0
                                            ));
              uVar32 = CONCAT71(uVar37,uVar50 != 0xff000000 || uVar27 != 0);
            }
            iVar42 = 0;
            local_8944 = 0;
            local_88c0 = local_88c0 & 0xffffffff00000000;
            uVar27 = 0;
            uVar16 = 0;
            local_892c = 0;
            local_88ec = 0;
            local_88cc = (uint)uVar32;
            if ((char)uVar32 == '\0') {
LAB_0010df0e:
              bVar51 = true;
              if (0 < (int)s->img_y) {
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,uStack_8920._4_4_);
                psVar33 = s->buffer_start;
                local_88c8 = s->buffer_start + 1;
                iVar39 = 0;
                iVar38 = 0;
                do {
                  local_88ac = iVar38;
                  if ((char)uVar32 == '\0') {
                    if (0 < (int)s->img_x) {
                      iVar38 = 0;
                      do {
                        puVar24 = s->img_buffer;
                        if (puVar24 < s->img_buffer_end) {
LAB_0010e0b1:
                          s->img_buffer = puVar24 + 1;
                          uVar13 = *puVar24;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                            if (iVar49 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar33;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar33;
                              s->img_buffer_end = psVar33 + iVar49;
                            }
                            puVar24 = s->img_buffer;
                            goto LAB_0010e0b1;
                          }
                          uVar13 = '\0';
                        }
                        data_01[(long)iVar39 + 2] = uVar13;
                        puVar24 = s->img_buffer;
                        if (puVar24 < s->img_buffer_end) {
LAB_0010e13d:
                          s->img_buffer = puVar24 + 1;
                          uVar13 = *puVar24;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                            if (iVar49 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar33;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar33;
                              s->img_buffer_end = psVar33 + iVar49;
                            }
                            puVar24 = s->img_buffer;
                            goto LAB_0010e13d;
                          }
                          uVar13 = '\0';
                        }
                        data_01[(long)iVar39 + 1] = uVar13;
                        puVar24 = s->img_buffer;
                        if (puVar24 < s->img_buffer_end) {
LAB_0010e1c6:
                          s->img_buffer = puVar24 + 1;
                          uVar13 = *puVar24;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                            if (iVar49 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar33;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar33;
                              s->img_buffer_end = psVar33 + iVar49;
                            }
                            puVar24 = s->img_buffer;
                            goto LAB_0010e1c6;
                          }
                          uVar13 = '\0';
                        }
                        data_01[iVar39] = uVar13;
                        bVar12 = 0xff;
                        if ((char)local_88d8 != '\0') {
                          pbVar25 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar25) {
                            if (s->read_from_callbacks == 0) {
                              bVar12 = 0;
                              goto LAB_0010e26b;
                            }
                            iVar49 = (*(s->io).read)(s->io_user_data,(char *)psVar33,s->buflen);
                            if (iVar49 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar33;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar33;
                              s->img_buffer_end = psVar33 + iVar49;
                            }
                            pbVar25 = s->img_buffer;
                          }
                          s->img_buffer = pbVar25 + 1;
                          bVar12 = *pbVar25;
                        }
LAB_0010e26b:
                        iVar49 = iVar39 + 3;
                        if (iVar14 == 4) {
                          data_01[(long)iVar39 + 3] = bVar12;
                          iVar49 = iVar39 + 4;
                        }
                        iVar39 = iVar49;
                        local_8938 = local_8938 | bVar12;
                        iVar38 = iVar38 + 1;
                      } while (iVar38 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar38 = 0;
                    do {
                      uVar28 = stbi__get16le(s);
                      if (local_8928._0_4_ != 0x10) {
                        iVar49 = stbi__get16le(s);
                        uVar28 = uVar28 | iVar49 << 0x10;
                      }
                      iVar49 = stbi__shiftsigned(uVar28 & (uint)local_88e0,iVar43,uVar27);
                      data_01[iVar39] = (uchar)iVar49;
                      iVar49 = stbi__shiftsigned(uVar28 & (uint)local_8918,iVar42,uVar16);
                      data_01[(long)iVar39 + 1] = (uchar)iVar49;
                      iVar49 = stbi__shiftsigned(uVar28 & local_8918._4_4_,local_8944,local_892c);
                      data_01[(long)iVar39 + 2] = (uchar)iVar49;
                      if (uVar50 == 0) {
                        uVar28 = 0xff;
                      }
                      else {
                        uVar28 = stbi__shiftsigned(uVar28 & uVar50,(int)local_88c0,local_88ec);
                      }
                      iVar49 = iVar39 + 3;
                      if (iVar14 == 4) {
                        data_01[(long)iVar39 + 3] = (uchar)uVar28;
                        iVar49 = iVar39 + 4;
                      }
                      iVar39 = iVar49;
                      local_8938 = local_8938 | uVar28;
                      iVar38 = iVar38 + 1;
                    } while (iVar38 < (int)s->img_x);
                  }
                  stbi__skip(s,local_88b0);
                  iVar38 = local_88ac + 1;
                  uVar32 = (ulong)local_88cc;
                } while (iVar38 < (int)s->img_y);
                bVar51 = true;
              }
            }
            else {
              if (((uint)local_8918 != 0 && uStack_8920._4_4_ != 0) && local_8918._4_4_ != 0) {
                iVar43 = stbi__high_bit(uStack_8920._4_4_);
                iVar43 = iVar43 + -7;
                uVar27 = (uStack_8920._4_4_ >> 1 & 0x55555555) + (uStack_8920._4_4_ & 0x55555555);
                uVar27 = (uVar27 >> 2 & 0x33333333) + (uVar27 & 0x33333333);
                uVar27 = (uVar27 >> 4) + uVar27 & 0xf0f0f0f;
                uVar27 = (uVar27 >> 8) + uVar27;
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,uStack_8920._4_4_);
                uVar27 = (uVar27 >> 0x10) + uVar27 & 0xff;
                iVar42 = stbi__high_bit((uint)local_8918);
                iVar42 = iVar42 + -7;
                uVar16 = ((uint)local_8918 >> 1 & 0x55555555) + ((uint)local_8918 & 0x55555555);
                uVar16 = (uVar16 >> 2 & 0x33333333) + (uVar16 & 0x33333333);
                uVar16 = (uVar16 >> 4) + uVar16 & 0xf0f0f0f;
                uVar16 = (uVar16 >> 8) + uVar16;
                uVar16 = (uVar16 >> 0x10) + uVar16 & 0xff;
                iVar38 = stbi__high_bit(local_8918._4_4_);
                local_8944 = iVar38 + -7;
                uVar28 = (local_8918._4_4_ >> 1 & 0x55555555) + (local_8918._4_4_ & 0x55555555);
                uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                uVar28 = (uVar28 >> 8) + uVar28;
                local_892c = (uVar28 >> 0x10) + uVar28 & 0xff;
                iVar38 = stbi__high_bit(uVar50);
                uVar32 = (ulong)local_88cc;
                local_88c0 = CONCAT44(local_88c0._4_4_,iVar38 + -7);
                uVar28 = (uVar50 >> 1 & 0x55555555) + (uVar50 & 0x55555555);
                uVar28 = (uVar28 >> 2 & 0x33333333) + (uVar28 & 0x33333333);
                uVar28 = (uVar28 >> 4) + uVar28 & 0xf0f0f0f;
                uVar28 = (uVar28 >> 8) + uVar28;
                local_88ec = (uVar28 >> 0x10) + uVar28 & 0xff;
                uStack_8920._4_4_ = (uint)local_88e0;
                goto LAB_0010df0e;
              }
              free(data_01);
              stbi__g_failure_reason = "bad masks";
              bVar51 = false;
            }
            if (!bVar51) goto LAB_0010b2d5;
          }
          piVar46 = local_88e8;
          if (((iVar14 == 4) && (local_8938 == 0)) &&
             (iVar43 = s->img_x * s->img_y * 4, -1 < iVar43 + -1)) {
            lVar19 = (ulong)(iVar43 - 4) + 7;
            do {
              data_01[lVar19 + -4] = 0xff;
              lVar19 = lVar19 + -4;
            } while (3 < lVar19);
          }
          if (0 < (int)local_88b4) {
            uVar50 = (int)s->img_y >> 1;
            if (0 < (int)uVar50) {
              uVar16 = s->img_x * iVar14;
              uVar27 = (s->img_y - 1) * uVar16;
              uVar32 = 0;
              uVar31 = 0;
              do {
                if (0 < (int)uVar16) {
                  uVar41 = 0;
                  do {
                    uVar13 = data_01[uVar41 + uVar32];
                    data_01[uVar41 + uVar32] = data_01[uVar41 + uVar27];
                    data_01[uVar41 + uVar27] = uVar13;
                    uVar41 = uVar41 + 1;
                  } while (uVar16 != uVar41);
                }
                uVar31 = uVar31 + 1;
                uVar27 = uVar27 - uVar16;
                uVar32 = (ulong)((int)uVar32 + uVar16);
              } while (uVar31 != uVar50);
            }
          }
          if (((req_comp == 0) || (iVar14 == req_comp)) ||
             (data_01 = stbi__convert_format(data_01,iVar14,req_comp,s->img_x,s->img_y),
             data_01 != (uchar *)0x0)) {
            *local_8900 = s->img_x;
            *local_88f8 = s->img_y;
            if (piVar46 == (int *)0x0) {
              return data_01;
            }
            *piVar46 = s->img_n;
            return data_01;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar34 = s->buffer_start;
        iVar14 = (*(s->io).read)(s->io_user_data,(char *)psVar34,s->buflen);
        if (iVar14 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar34;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar34;
          s->img_buffer_end = psVar34 + iVar14;
        }
        psVar34 = s->img_buffer;
        goto LAB_0010ca61;
      }
LAB_0010cc9b:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar14 = stbi__gif_test(s);
      if (iVar14 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar22 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88e8,0,psVar33);
        if (psVar22 == s) {
          psVar22 = (stbi__context *)0x0;
        }
        if (psVar22 == (stbi__context *)0x0) {
          if (local_88a8.out != (stbi_uc *)0x0) {
            free(local_88a8.out);
          }
          psVar22 = (stbi__context *)0x0;
        }
        else {
          *local_8900 = local_88a8.w;
          *local_88f8 = local_88a8.h;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar22 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar22,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar18 = (stbi__jpeg *)local_88a8.background;
        goto LAB_0010d8fc;
      }
      iVar14 = stbi__psd_test(s);
      if (iVar14 != 0) {
        pvVar20 = stbi__psd_load(s,(int *)local_8900,(int *)local_88f8,local_88e8,req_comp,ri,bpc);
        return pvVar20;
      }
      iVar14 = stbi__pic_test(s);
      piVar46 = local_88e8;
      if (iVar14 != 0) {
        pvVar20 = stbi__pic_load(s,(int *)local_8900,(int *)local_88f8,local_88e8,req_comp,ri_00);
        return pvVar20;
      }
      iVar14 = stbi__pnm_test(s);
      if (iVar14 != 0) {
        pvVar20 = stbi__pnm_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
        return pvVar20;
      }
      iVar14 = stbi__hdr_test(s);
      psVar10 = local_88f8;
      psVar9 = local_8900;
      if (iVar14 != 0) {
        data_02 = stbi__hdr_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar46;
        }
        psVar33 = stbi__hdr_to_ldr(data_02,*psVar9,*psVar10,req_comp);
        return psVar33;
      }
      iVar14 = stbi__tga_test(s);
      if (iVar14 != 0) {
        pvVar20 = stbi__tga_load(s,(int *)local_8900,(int *)local_88f8,piVar46,req_comp,ri_00);
        return pvVar20;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_0010b2d5:
    psVar22 = (stbi__context *)0x0;
  }
  return psVar22;
LAB_0010c7ec:
  iVar14 = 0;
LAB_0010c804:
  if (iVar14 == 0) goto LAB_0010d8e7;
  if (psVar18->marker != 0xff) goto LAB_0010c816;
LAB_0010c823:
  do {
    psVar22 = psVar18->s;
    if ((psVar22->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010c83f:
      if (psVar22->img_buffer_end <= psVar22->img_buffer) goto LAB_0010c816;
    }
    else {
      iVar14 = (*(psVar22->io).eof)(psVar22->io_user_data);
      if (iVar14 != 0) {
        if (psVar22->read_from_callbacks != 0) goto LAB_0010c83f;
        goto LAB_0010c816;
      }
    }
    psVar22 = psVar18->s;
    psVar33 = psVar22->img_buffer;
    if (psVar22->img_buffer_end <= psVar33) {
      if (psVar22->read_from_callbacks == 0) goto LAB_0010c823;
      psVar33 = psVar22->buffer_start;
      iVar14 = (*(psVar22->io).read)(psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
      if (iVar14 == 0) {
        psVar22->read_from_callbacks = 0;
        psVar22->img_buffer = psVar33;
        psVar22->img_buffer_end = psVar22->buffer_start + 1;
        psVar22->buffer_start[0] = '\0';
      }
      else {
        psVar22->img_buffer = psVar33;
        psVar22->img_buffer_end = psVar33 + iVar14;
      }
      psVar33 = psVar22->img_buffer;
    }
    psVar22->img_buffer = psVar33 + 1;
  } while (*psVar33 != 0xff);
  psVar22 = psVar18->s;
  psVar33 = psVar22->img_buffer;
  if (psVar33 < psVar22->img_buffer_end) {
LAB_0010c941:
    psVar22->img_buffer = psVar33 + 1;
    sVar11 = *psVar33;
  }
  else {
    if (psVar22->read_from_callbacks != 0) {
      psVar33 = psVar22->buffer_start;
      iVar14 = (*(psVar22->io).read)(psVar22->io_user_data,(char *)psVar33,psVar22->buflen);
      if (iVar14 == 0) {
        psVar22->read_from_callbacks = 0;
        psVar22->img_buffer = psVar33;
        psVar22->img_buffer_end = psVar22->buffer_start + 1;
        psVar22->buffer_start[0] = '\0';
      }
      else {
        psVar22->img_buffer = psVar33;
        psVar22->img_buffer_end = psVar33 + iVar14;
      }
      psVar33 = psVar22->img_buffer;
      goto LAB_0010c941;
    }
    sVar11 = '\0';
  }
  psVar18->marker = sVar11;
LAB_0010c816:
  bVar12 = stbi__get_marker(psVar18);
  goto LAB_0010b369;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}